

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::SubDataToUndefinedCase::iterate(SubDataToUndefinedCase *this)

{
  CallLogWrapper *this_00;
  pointer pVVar1;
  pointer pVVar2;
  deUint32 buffer;
  uint uVar3;
  int iVar4;
  char *description;
  bool bVar5;
  size_t in_R9;
  pointer pVVar6;
  pointer pVVar7;
  pointer pVVar8;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> definedRanges;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> local_98;
  BufferVerifier local_78;
  deUint32 local_6c;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> local_68;
  ReferenceBuffer local_48;
  
  local_6c = deStringHash((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.
                          m_name._M_dataplus._M_p);
  BufferTestUtil::BufferVerifier::BufferVerifier
            (&local_78,(this->super_BufferCase).super_TestCase.m_context,this->m_verify);
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BufferTestUtil::ReferenceBuffer::setSize(&local_48,this->m_size);
  buffer = BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_target,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_target,(long)this->m_size,(void *)0x0,this->m_usage);
  BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
  pVVar6 = (this->m_ranges).
           super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar7 = local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar8 = local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (pVVar6 != (this->m_ranges).
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar3 = pVVar6->m_data[1] + pVVar6->m_data[0];
      uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 0x3d) * 9;
      uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
      BufferTestUtil::fillWithRandomBytes
                (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + pVVar6->m_data[0],pVVar6->m_data[1],
                 uVar3 >> 0xf ^ local_6c ^ uVar3);
      glu::CallLogWrapper::glBufferSubData
                (this_00,this->m_target,(long)pVVar6->m_data[0],(long)pVVar6->m_data[1],
                 local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + pVVar6->m_data[0]);
      addRangeToList(&local_68,&local_98,pVVar6);
      pVVar2 = local_68.
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      pVVar1 = local_68.
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_68.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_68.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pVVar7 != (pointer)0x0) {
        operator_delete(pVVar7,(long)pVVar8 - (long)pVVar7);
      }
      if (local_68.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pVVar6 = pVVar6 + 1;
      pVVar7 = pVVar1;
      pVVar8 = pVVar2;
    } while (pVVar6 != (this->m_ranges).
                       super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pVVar7 = local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar6 = local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bVar5 = true;
  if (local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar8 = local_98.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar5 = true;
    do {
      iVar4 = BufferTestUtil::BufferVerifier::verify
                        (&local_78,(EVP_PKEY_CTX *)(ulong)buffer,
                         local_48.m_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(ulong)(uint)pVVar8->m_data[0],
                         (uchar *)(ulong)(uint)pVVar8->m_data[1],in_R9);
      if ((char)iVar4 == '\0') {
        bVar5 = false;
      }
      pVVar8 = pVVar8 + 1;
    } while (pVVar8 != pVVar7);
  }
  BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
  description = "Buffer verification failed";
  if (bVar5) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (uint)(byte)~bVar5,description);
  if (pVVar6 != (pointer)0x0) {
    operator_delete(pVVar6,(long)local_98.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar6);
  }
  if (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_48.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BufferTestUtil::BufferVerifier::~BufferVerifier(&local_78);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			dataSeed	= deStringHash(getName());
		BufferVerifier			verifier	(m_context, m_verify);
		ReferenceBuffer			refBuf;
		bool					isOk		= true;
		std::vector<tcu::IVec2>	definedRanges;

		refBuf.setSize(m_size);

		deUint32 buf = genBuffer();
		glBindBuffer(m_target, buf);

		// Initialize storage with glBufferData()
		glBufferData(m_target, m_size, DE_NULL, m_usage);
		checkError();

		// Fill specified ranges with glBufferSubData()
		for (vector<tcu::IVec2>::const_iterator range = m_ranges.begin(); range != m_ranges.end(); range++)
		{
			fillWithRandomBytes(refBuf.getPtr()+range->x(), range->y(), dataSeed ^ deInt32Hash(range->x()+range->y()));
			glBufferSubData(m_target, range->x(), range->y(), refBuf.getPtr()+range->x());

			// Mark range as defined
			definedRanges = addRangeToList(definedRanges, *range);
		}

		// Verify defined parts
		for (vector<tcu::IVec2>::const_iterator range = definedRanges.begin(); range != definedRanges.end(); range++)
		{
			if (!verifier.verify(buf, refBuf.getPtr(), range->x(), range->y()))
				isOk = false;
		}

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}